

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

QVariant * __thiscall
QAbstractSpinBoxPrivate::getZeroVariant
          (QVariant *__return_storage_ptr__,QAbstractSpinBoxPrivate *this)

{
  long in_FS_OFFSET;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  if (this->type == Double) {
    ::QVariant::QVariant(&QStack_38,0.0);
  }
  else {
    if (this->type != Int) goto LAB_00440cd7;
    ::QVariant::QVariant(&QStack_38,0);
  }
  ::QVariant::operator=(__return_storage_ptr__,&QStack_38);
  ::QVariant::~QVariant(&QStack_38);
LAB_00440cd7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAbstractSpinBoxPrivate::getZeroVariant() const
{
    QVariant ret;
    switch (type) {
    case QMetaType::Int: ret = QVariant(0); break;
    case QMetaType::Double: ret = QVariant(0.0); break;
    default: break;
    }
    return ret;
}